

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

Matrix<float,_4,_3> *
tcu::operator*(Matrix<float,_4,_3> *__return_storage_ptr__,Matrix<float,_4,_3> *a,
              Matrix<float,_3,_3> *b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int row_1;
  Vector<float,_4> *pVVar3;
  Matrix<float,_4,_3> *res;
  long lVar4;
  int row;
  long lVar5;
  Vector<float,_3> *pVVar6;
  long lVar7;
  float v;
  float fVar8;
  undefined1 auVar9 [16];
  bool bVar11;
  undefined4 uVar12;
  long lVar10;
  
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = 0.0;
  pVVar3 = (__return_storage_ptr__->m_data).m_data;
  pVVar3[2].m_data[2] = 0.0;
  pVVar3[2].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = 0.0;
  pVVar3 = (__return_storage_ptr__->m_data).m_data;
  pVVar3[1].m_data[2] = 0.0;
  pVVar3[1].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[2] = 0.0;
  auVar2 = _DAT_019f34d0;
  auVar1 = _DAT_019ec5b0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[3] = 0.0;
  pVVar3 = (__return_storage_ptr__->m_data).m_data + 1;
  lVar4 = 0;
  lVar5 = 0;
  do {
    lVar7 = 0;
    auVar9 = auVar2;
    do {
      bVar11 = SUB164(auVar9 ^ auVar1,4) == -0x80000000 && SUB164(auVar9 ^ auVar1,0) < -0x7ffffffd;
      if (bVar11) {
        uVar12 = 0x3f800000;
        if (lVar4 != lVar7) {
          uVar12 = 0;
        }
        *(undefined4 *)
         ((long)((Vector<tcu::Vector<float,_4>,_3> *)(pVVar3 + -1))->m_data[0].m_data + lVar7) =
             uVar12;
      }
      if (bVar11) {
        uVar12 = 0x3f800000;
        if (lVar4 + -0x10 != lVar7) {
          uVar12 = 0;
        }
        *(undefined4 *)((long)pVVar3->m_data + lVar7) = uVar12;
      }
      lVar10 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 2;
      auVar9._8_8_ = lVar10 + 2;
      lVar7 = lVar7 + 0x20;
    } while (lVar7 != 0x40);
    lVar5 = lVar5 + 1;
    lVar4 = lVar4 + 0x10;
    pVVar3 = (Vector<float,_4> *)(pVVar3->m_data + 1);
  } while (lVar5 != 4);
  lVar4 = 0;
  do {
    lVar5 = 0;
    pVVar6 = (Vector<float,_3> *)b;
    do {
      fVar8 = 0.0;
      lVar7 = 0;
      do {
        fVar8 = fVar8 + *(float *)((long)a + lVar7 * 4) *
                        *(float *)((long)((Vector<tcu::Vector<float,_3>,_3> *)pVVar6->m_data)->
                                         m_data[0].m_data + lVar7);
        lVar7 = lVar7 + 4;
      } while (lVar7 != 0xc);
      (__return_storage_ptr__->m_data).m_data[lVar5].m_data[lVar4] = fVar8;
      lVar5 = lVar5 + 1;
      pVVar6 = pVVar6 + 1;
    } while (lVar5 != 3);
    lVar4 = lVar4 + 1;
    a = (Matrix<float,_4,_3> *)((long)a + 4);
  } while (lVar4 != 4);
  return __return_storage_ptr__;
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}